

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_getcBlockSize(void *src,size_t srcSize,blockProperties_t *bpPtr)

{
  U32 UVar1;
  uint *in_RDX;
  ulong in_RSI;
  U32 cSize;
  U32 cBlockHeader;
  ulong local_8;
  
  if (in_RSI < 3) {
    local_8 = 0xffffffffffffffb8;
  }
  else {
    UVar1 = MEM_readLE24((void *)0x1fef90);
    in_RDX[1] = UVar1 & 1;
    *in_RDX = UVar1 >> 1 & 3;
    in_RDX[2] = UVar1 >> 3;
    if (*in_RDX == 1) {
      local_8 = 1;
    }
    else if (*in_RDX == 3) {
      local_8 = 0xffffffffffffffec;
    }
    else {
      local_8 = (ulong)(UVar1 >> 3);
    }
  }
  return local_8;
}

Assistant:

size_t ZSTD_getcBlockSize(const void* src, size_t srcSize,
                          blockProperties_t* bpPtr)
{
    if (srcSize < ZSTD_blockHeaderSize) return ERROR(srcSize_wrong);
    {   U32 const cBlockHeader = MEM_readLE24(src);
        U32 const cSize = cBlockHeader >> 3;
        bpPtr->lastBlock = cBlockHeader & 1;
        bpPtr->blockType = (blockType_e)((cBlockHeader >> 1) & 3);
        bpPtr->origSize = cSize;   /* only useful for RLE */
        if (bpPtr->blockType == bt_rle) return 1;
        if (bpPtr->blockType == bt_reserved) return ERROR(corruption_detected);
        return cSize;
    }
}